

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::strcpy_insitu_allow<unsigned_long>
               (size_t length,unsigned_long *header,uintptr_t header_mask,char_t *target)

{
  size_t sVar1;
  bool local_42;
  bool local_41;
  size_t reuse_threshold;
  size_t target_length;
  char_t *target_local;
  uintptr_t header_mask_local;
  unsigned_long *header_local;
  size_t length_local;
  
  if ((*header & 0x40) == 0) {
    sVar1 = strlength(target);
    if ((*header & header_mask) == 0) {
      length_local._7_1_ = length <= sVar1;
    }
    else {
      local_41 = false;
      if (length <= sVar1) {
        local_42 = sVar1 < 0x20 || sVar1 - length < sVar1 >> 1;
        local_41 = local_42;
      }
      length_local._7_1_ = local_41;
    }
  }
  else {
    length_local._7_1_ = false;
  }
  return length_local._7_1_;
}

Assistant:

inline bool strcpy_insitu_allow(size_t length, const Header& header, uintptr_t header_mask, char_t* target)
	{
		// never reuse shared memory
		if (header & xml_memory_page_contents_shared_mask) return false;

		size_t target_length = strlength(target);

		// always reuse document buffer memory if possible
		if ((header & header_mask) == 0) return target_length >= length;

		// reuse heap memory if waste is not too great
		const size_t reuse_threshold = 32;

		return target_length >= length && (target_length < reuse_threshold || target_length - length < target_length / 2);
	}